

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O2

ion_err_t ion_lookup_in_master_table(ion_dictionary_id_t id,ion_dictionary_config_info_t *config)

{
  ion_err_t iVar1;
  
  config->id = id;
  iVar1 = ion_master_table_read(config,-1);
  return iVar1;
}

Assistant:

ion_err_t
ion_lookup_in_master_table(
	ion_dictionary_id_t				id,
	ion_dictionary_config_info_t	*config
) {
	ion_err_t error = err_ok;

	config->id	= id;
	error		= ion_master_table_read(config, ION_MASTER_TABLE_CALCULATE_POS);

	if (err_ok != error) {
		return error;
	}

	return err_ok;
}